

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O0

void __thiscall xray_re::xr_spawn_object::load(xr_spawn_object *this,xr_reader *r)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  tools_class_id tVar4;
  size_t sVar5;
  char *name_00;
  cse_abstract *pcVar6;
  xr_scene *this_00;
  size_type sVar7;
  reference ppxVar8;
  float fVar9;
  undefined1 local_1060 [8];
  xr_custom_object_vec objects;
  xr_packet packet;
  size_t size;
  char *name;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_spawn_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar5 = xr_reader::r_chunk<unsigned_short>(r,0xe411,(unsigned_short *)((long)&name + 6));
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                  ,0x31,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
  }
  if (name._6_2_ != 0x14) {
    __assert_fail("version == SPAWNPOINT_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                  ,0x32,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,pxStack_18);
  sVar5 = xr_reader::find_chunk(pxStack_18,0xe419);
  if (sVar5 == 0) {
    xr_reader::r_chunk<unsigned_int>
              (pxStack_18,0xe417,(uint *)&(this->super_xr_custom_object).field_0x6c);
    if (*(int *)&(this->super_xr_custom_object).field_0x6c == 0) {
      sVar5 = xr_reader::find_chunk(pxStack_18,0xe413);
      if (sVar5 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                      ,0x48,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
      }
      uVar1 = xr_reader::r_u8(pxStack_18);
      (this->field_1).field_0.m_team = uVar1;
      uVar1 = xr_reader::r_u8(pxStack_18);
      (this->field_1).field_0.m_respawn = uVar1;
      uVar1 = xr_reader::r_u8(pxStack_18);
      (this->field_1).field_0.m_game = uVar1;
      xr_reader::advance(pxStack_18,1);
      xr_reader::debug_find_chunk(pxStack_18);
    }
    else {
      if (*(int *)&(this->super_xr_custom_object).field_0x6c != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                      ,0x5b,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
      }
      sVar5 = xr_reader::find_chunk(pxStack_18,0xe422);
      if (sVar5 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                      ,0x50,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
      }
      fVar9 = xr_reader::r_float(pxStack_18);
      (this->field_1).field_1.m_radius = fVar9;
      fVar9 = xr_reader::r_float(pxStack_18);
      (this->field_1).field_1.m_power = fVar9;
      fVar9 = xr_reader::r_float(pxStack_18);
      (this->field_1).field_1.m_view_distance = fVar9;
      uVar3 = xr_reader::r_u32(pxStack_18);
      (this->field_1).field_1.m_fog_color = uVar3;
      fVar9 = xr_reader::r_float(pxStack_18);
      (this->field_1).field_1.m_fog_density = fVar9;
      uVar3 = xr_reader::r_u32(pxStack_18);
      (this->field_1).field_1.m_ambient_color = uVar3;
      uVar3 = xr_reader::r_u32(pxStack_18);
      (this->field_1).field_1.m_sky_color = uVar3;
      xr_reader::debug_find_chunk(pxStack_18);
      xr_reader::r_chunk<unsigned_int>(pxStack_18,0xe423,&(this->field_1).field_1.m_hemi_color);
    }
  }
  else {
    *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = 2;
    name_00 = xr_reader::skip_sz(pxStack_18);
    xr_reader::debug_find_chunk(pxStack_18);
    sVar5 = xr_reader::find_chunk(pxStack_18,0xe420);
    if (sVar5 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x3c,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
    }
    uVar3 = xr_reader::r_u32(pxStack_18);
    xr_packet::xr_packet
              ((xr_packet *)
               &objects.
                super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    xr_reader::r_packet(pxStack_18,
                        (xr_packet *)
                        &objects.
                         super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
    xr_reader::debug_find_chunk(pxStack_18);
    pcVar6 = create_entity(name_00);
    (this->field_1).m_entity = pcVar6;
    if ((this->field_1).m_entity == (cse_abstract *)0x0) {
      __assert_fail("m_entity",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x42,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
    }
    cse_abstract::spawn_read
              ((this->field_1).m_entity,
               (xr_packet *)
               &objects.
                super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::vector
            ((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
             local_1060);
  this_00 = xr_custom_object::scene(&this->super_xr_custom_object);
  xr_scene::load_objects(this_00,pxStack_18,0xe421,(xr_custom_object_vec *)local_1060);
  bVar2 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
          empty((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *
                )local_1060);
  if (!bVar2) {
    sVar7 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
            size((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                  *)local_1060);
    bVar2 = false;
    if (sVar7 == 1) {
      ppxVar8 = std::
                vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
                operator[]((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            *)local_1060,0);
      tVar4 = xr_custom_object::class_id(*ppxVar8);
      bVar2 = tVar4 == TOOLS_CLASS_SHAPE;
    }
    if (!bVar2) {
      __assert_fail("objects.size() == 1 && objects[0]->class_id() == TOOLS_CLASS_SHAPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0x62,"virtual void xray_re::xr_spawn_object::load(xr_reader &)");
    }
    ppxVar8 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
              ::operator[]((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            *)local_1060,0);
    this->m_attached_object = *ppxVar8;
  }
  std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::~vector
            ((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
             local_1060);
  return;
}

Assistant:

void xr_spawn_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk(SPAWNPOINT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SPAWNPOINT_VERSION);

	xr_custom_object::load(r);

	if (r.find_chunk(SPAWNPOINT_CHUNK_SECTION)) {
		m_type = SPAWNPOINT_TYPE_ENTITY;
		const char* name = r.skip_sz();
		r.debug_find_chunk();

		if (!r.find_chunk(SPAWNPOINT_CHUNK_SPAWNDATA))
			xr_not_expected();
		size_t size = r.r_u32();
		xr_packet packet;
		r.r_packet(packet, size);
		r.debug_find_chunk();
		m_entity = create_entity(name);
		xr_assert(m_entity);
		m_entity->spawn_read(packet);
	} else {
		r.r_chunk<uint32_t>(SPAWNPOINT_CHUNK_TYPE, m_type);
		if (m_type == SPAWNPOINT_TYPE_RPOINT) {
			if (!r.find_chunk(SPAWNPOINT_CHUNK_RPOINT_PARAMS))
				xr_not_expected();
			m_team = r.r_u8();
			m_respawn = r.r_u8();
			m_game = r.r_u8();
			r.advance(sizeof(uint8_t));
			r.debug_find_chunk();
		} else if (m_type == SPAWNPOINT_TYPE_ENV_MOD) {
			if (!r.find_chunk(SPAWNPOINT_CHUNK_ENV_MOD_PARAMS))
				xr_not_expected();
			m_radius = r.r_float();
			m_power = r.r_float();
			m_view_distance = r.r_float();
			m_fog_color = r.r_u32();
			m_fog_density = r.r_float();
			m_ambient_color = r.r_u32();
			m_sky_color = r.r_u32();
			r.debug_find_chunk();
			r.r_chunk<uint32_t>(SPAWNPOINT_CHUNK_ENV_MOD_HEMI, m_hemi_color);
		} else {
			xr_not_expected();
		}
	}

	xr_custom_object_vec objects;
	scene().load_objects(r, SPAWNPOINT_CHUNK_ATTACHED_OBJECT, objects);
	if (!objects.empty()) {
		xr_assert(objects.size() == 1 && objects[0]->class_id() == TOOLS_CLASS_SHAPE);
		m_attached_object = objects[0];
	}
}